

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

void Gia_ManObjAddToFrontier(Swp_Man_t *p,int Id,Vec_Int_t *vFront)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj;
  Vec_Int_t *vFront_local;
  int Id_local;
  Swp_Man_t *p_local;
  
  if ((Id != 0) && (iVar1 = Swp_ManObj2Lit(p,Id), iVar1 == 0)) {
    pObj_00 = Gia_ManObj(p->pGia,Id);
    iVar1 = p->nSatVars;
    p->nSatVars = iVar1 + 1;
    iVar1 = Abc_Var2Lit(iVar1,(uint)((ulong)*(undefined8 *)pObj_00 >> 0x3f));
    Swp_ManSetObj2Lit(p,Id,iVar1);
    sat_solver_setnvars(p->pSat,p->nSatVars + 100);
    iVar1 = Gia_ObjIsAnd(pObj_00);
    if (iVar1 != 0) {
      Vec_IntPush(vFront,Id);
    }
  }
  return;
}

Assistant:

static void Gia_ManObjAddToFrontier( Swp_Man_t * p, int Id, Vec_Int_t * vFront )
{
    Gia_Obj_t * pObj;
    if ( Id == 0 || Swp_ManObj2Lit(p, Id) )
        return;
    pObj = Gia_ManObj( p->pGia, Id );
    Swp_ManSetObj2Lit( p, Id, Abc_Var2Lit(p->nSatVars++, pObj->fPhase) );
    sat_solver_setnvars( p->pSat, p->nSatVars + 100 );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_IntPush( vFront, Id );
}